

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.cpp
# Opt level: O1

void multithreading(void)

{
  Header *pHVar1;
  int iVar2;
  char fileName [1];
  OutputFile out;
  InputFile in;
  Header header;
  char local_79;
  OutputFile local_78 [16];
  InputFile local_68 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  Header local_48 [56];
  
  local_79 = '\0';
  Imf_3_4::setGlobalThreadCount(4);
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile(local_68,&local_79,iVar2);
  pHVar1 = (Header *)Imf_3_4::InputFile::header();
  Imf_3_4::Header::Header(local_48,pHVar1);
  Imf_3_4::OutputFile::OutputFile(local_78,&local_79,local_48,2);
  Imf_3_4::OutputFile::~OutputFile(local_78);
  Imf_3_4::Header::~Header(local_48);
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  return;
}

Assistant:

void multithreading()
{
    #include "multithreading.cpp"
}